

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::OffsetIndex::printTo(OffsetIndex *this,ostream *out)

{
  _OffsetIndex__isset _Var1;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"OffsetIndex(",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"page_locations=",0xf);
  duckdb_apache::thrift::to_string<duckdb_parquet::PageLocation>(&local_48,&this->page_locations);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"unencoded_byte_array_data_bytes=",0x20);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_48,&this->unencoded_byte_array_data_bytes);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void OffsetIndex::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "OffsetIndex(";
  out << "page_locations=" << to_string(page_locations);
  out << ", " << "unencoded_byte_array_data_bytes="; (__isset.unencoded_byte_array_data_bytes ? (out << to_string(unencoded_byte_array_data_bytes)) : (out << "<null>"));
  out << ")";
}